

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O2

bool getOriginalDst(Socket *s,uint32 *addr,uint16 *port)

{
  bool bVar1;
  sockaddr_in destAddr;
  usize destAddrLen;
  
  destAddrLen = 0x10;
  bVar1 = Socket::getSockOpt(s,0,0x50,&destAddr,&destAddrLen);
  if (bVar1) {
    *addr = destAddr.sin_addr.s_addr >> 0x18 | (destAddr.sin_addr.s_addr & 0xff0000) >> 8 |
            (destAddr.sin_addr.s_addr & 0xff00) << 8 | destAddr.sin_addr.s_addr << 0x18;
    *port = destAddr.sin_port << 8 | destAddr.sin_port >> 8;
  }
  return bVar1;
}

Assistant:

bool getOriginalDst(Socket& s, uint32& addr, uint16& port)
{
#ifdef _WIN32
    return s.getSockName(addr, port);
#else
    sockaddr_in destAddr;
    usize destAddrLen = sizeof(destAddr);
    if(!s.getSockOpt(SOL_IP, SO_ORIGINAL_DST, &destAddr, destAddrLen))
        return false;
    addr = ntohl(destAddr.sin_addr.s_addr);
    port = ntohs(destAddr.sin_port);
    return true;
#endif
}